

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O1

int bin_mdef_write_text(bin_mdef_t *m,char *filename)

{
  uint8 uVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  FILE *__s;
  mdef_entry_t *pmVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  iVar3 = strcmp(filename,"-");
  __s = _stdout;
  if ((iVar3 == 0) || (__s = fopen(filename,"w"), __s != (FILE *)0x0)) {
    fwrite("0.3\n",4,1,__s);
    uVar4 = 0;
    fprintf(__s,"%d n_base\n",(ulong)(uint)m->n_ciphone);
    fprintf(__s,"%d n_tri\n",(ulong)(uint)(m->n_phone - m->n_ciphone));
    uVar5 = m->n_phone;
    if (m->n_emit_state == 0) {
      if (0 < (int)uVar5) {
        lVar10 = 0;
        uVar4 = 0;
        do {
          uVar4 = uVar4 + m->sseq_len[*(int *)((long)&m->phone->ssid + lVar10)] + 1;
          lVar10 = lVar10 + 0xc;
        } while ((ulong)uVar5 * 0xc != lVar10);
      }
    }
    else {
      uVar4 = (m->n_emit_state + 1) * uVar5;
    }
    uVar11 = 0;
    fprintf(__s,"%d n_state_map\n",(ulong)uVar4);
    fprintf(__s,"%d n_tied_state\n",(ulong)(uint)m->n_sen);
    fprintf(__s,"%d n_tied_ci_state\n",(ulong)(uint)m->n_ci_sen);
    fprintf(__s,"%d n_tied_tmat\n",(ulong)(uint)m->n_tmat);
    fwrite("#\n# Columns definitions\n",0x18,1,__s);
    fprintf(__s,"#%4s %3s %3s %1s %6s %4s %s\n","base","lft","rt","p","attrib","tmat",
            "     ... state id\'s ...");
    if (0 < m->n_ciphone) {
      uVar11 = 0;
      do {
        fprintf(__s,"%5s %3s %3s %1s",m->ciname[uVar11],"-","-","-");
        if ((long)uVar11 < (long)m->n_ciphone) {
          pmVar7 = m->phone;
          uVar9 = uVar11;
        }
        else {
          pmVar7 = m->phone;
          uVar9 = (ulong)pmVar7[uVar11].info.ci.reserved[0];
        }
        pcVar8 = "filler";
        if (pmVar7[uVar9].info.ci.filler == '\0') {
          pcVar8 = "n/a";
        }
        fprintf(__s," %6s",pcVar8);
        fprintf(__s," %4d",(ulong)(uint)m->phone[uVar11].tmat);
        uVar5 = m->n_emit_state;
        if (uVar5 == 0) {
          uVar5 = (uint)m->sseq_len[m->phone[uVar11].ssid];
        }
        if (0 < (int)uVar5) {
          uVar9 = 0;
          do {
            fprintf(__s," %6u",(ulong)m->sseq[m->phone[uVar11].ssid][uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
        }
        fwrite(" N\n",3,1,__s);
        uVar11 = uVar11 + 1;
      } while ((long)uVar11 < (long)m->n_ciphone);
    }
    if ((int)uVar11 < m->n_phone) {
      uVar11 = uVar11 & 0xffffffff;
      do {
        ppcVar2 = m->ciname;
        pmVar7 = m->phone;
        fprintf(__s,"%5s %3s %3s %c",ppcVar2[pmVar7[uVar11].info.ci.reserved[0]],
                ppcVar2[pmVar7[uVar11].info.ci.reserved[1]],
                ppcVar2[pmVar7[uVar11].info.ci.reserved[2]],
                (ulong)(uint)(int)"ibesu"[pmVar7[uVar11].info.ci.filler]);
        pmVar7 = m->phone;
        if ((long)uVar11 < (long)m->n_ciphone) {
          uVar1 = pmVar7[uVar11].info.ci.filler;
        }
        else {
          uVar1 = pmVar7[pmVar7[uVar11].info.ci.reserved[0]].info.ci.filler;
        }
        pcVar8 = "filler";
        if (uVar1 == '\0') {
          pcVar8 = "n/a";
        }
        fprintf(__s," %6s",pcVar8);
        fprintf(__s," %4d",(ulong)(uint)m->phone[uVar11].tmat);
        uVar5 = m->n_emit_state;
        if (uVar5 == 0) {
          uVar5 = (uint)m->sseq_len[m->phone[uVar11].ssid];
        }
        if (0 < (int)uVar5) {
          uVar9 = 0;
          do {
            fprintf(__s," %6u",(ulong)m->sseq[m->phone[uVar11].ssid][uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
        }
        fwrite(" N\n",3,1,__s);
        uVar11 = uVar11 + 1;
      } while ((int)uVar11 < m->n_phone);
    }
    iVar6 = strcmp(filename,"-");
    iVar3 = 0;
    if (iVar6 != 0) {
      fclose(__s);
      iVar3 = 0;
    }
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int
bin_mdef_write_text(bin_mdef_t * m, const char *filename)
{
    FILE *fh;
    int p, i, n_total_state;

    if (strcmp(filename, "-") == 0)
        fh = stdout;
    else {
        if ((fh = fopen(filename, "w")) == NULL)
            return -1;
    }

    fprintf(fh, "0.3\n");
    fprintf(fh, "%d n_base\n", m->n_ciphone);
    fprintf(fh, "%d n_tri\n", m->n_phone - m->n_ciphone);
    if (m->n_emit_state)
        n_total_state = m->n_phone * (m->n_emit_state + 1);
    else {
        n_total_state = 0;
        for (i = 0; i < m->n_phone; ++i)
            n_total_state += m->sseq_len[m->phone[i].ssid] + 1;
    }
    fprintf(fh, "%d n_state_map\n", n_total_state);
    fprintf(fh, "%d n_tied_state\n", m->n_sen);
    fprintf(fh, "%d n_tied_ci_state\n", m->n_ci_sen);
    fprintf(fh, "%d n_tied_tmat\n", m->n_tmat);
    fprintf(fh, "#\n# Columns definitions\n");
    fprintf(fh, "#%4s %3s %3s %1s %6s %4s %s\n",
            "base", "lft", "rt", "p", "attrib", "tmat",
            "     ... state id's ...");

    for (p = 0; p < m->n_ciphone; p++) {
        int n_state;

        fprintf(fh, "%5s %3s %3s %1s", m->ciname[p], "-", "-", "-");

        if (bin_mdef_is_fillerphone(m, p))
            fprintf(fh, " %6s", "filler");
        else
            fprintf(fh, " %6s", "n/a");
        fprintf(fh, " %4d", m->phone[p].tmat);

        if (m->n_emit_state)
            n_state = m->n_emit_state;
        else
            n_state = m->sseq_len[m->phone[p].ssid];
        for (i = 0; i < n_state; i++) {
            fprintf(fh, " %6u", m->sseq[m->phone[p].ssid][i]);
        }
        fprintf(fh, " N\n");
    }


    for (; p < m->n_phone; p++) {
        int n_state;

        fprintf(fh, "%5s %3s %3s %c",
                m->ciname[m->phone[p].info.cd.ctx[0]],
                m->ciname[m->phone[p].info.cd.ctx[1]],
                m->ciname[m->phone[p].info.cd.ctx[2]],
                (WPOS_NAME)[m->phone[p].info.cd.wpos]);

        if (bin_mdef_is_fillerphone(m, p))
            fprintf(fh, " %6s", "filler");
        else
            fprintf(fh, " %6s", "n/a");
        fprintf(fh, " %4d", m->phone[p].tmat);


        if (m->n_emit_state)
            n_state = m->n_emit_state;
        else
            n_state = m->sseq_len[m->phone[p].ssid];
        for (i = 0; i < n_state; i++) {
            fprintf(fh, " %6u", m->sseq[m->phone[p].ssid][i]);
        }
        fprintf(fh, " N\n");
    }

    if (strcmp(filename, "-") != 0)
        fclose(fh);
    return 0;
}